

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O1

uint __thiscall
llvm::SourceMgr::AddIncludeFile
          (SourceMgr *this,string *Filename,SMLoc IncludeLoc,string *IncludedFile)

{
  AlignedCharArray<8UL,_8UL> AVar1;
  pointer pbVar2;
  undefined8 uVar3;
  SourceMgr *pSVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  pointer *__ptr;
  long lVar8;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  NewBufOrErr;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_a8;
  char *local_98;
  undefined8 uStack_90;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_80;
  byte local_70;
  SourceMgr *local_68;
  char *local_60;
  string *local_58;
  Child local_50 [2];
  Child local_40 [2];
  
  local_60 = IncludeLoc.Ptr;
  local_58 = Filename;
  std::__cxx11::string::_M_assign((string *)IncludedFile);
  Twine::Twine((Twine *)&local_a8.TStorage,IncludedFile);
  MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_80.TStorage,(Twine *)&local_a8.TStorage,-1,true,false);
  uVar5 = (ulong)((long)(this->IncludeDirectories).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->IncludeDirectories).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  local_68 = this;
  if (((int)uVar5 != 0) && ((local_70 & 1) != 0)) {
    uVar5 = uVar5 & 0xffffffff;
    lVar8 = 8;
    do {
      uVar5 = uVar5 - 1;
      pbVar2 = (local_68->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sys::path::get_separator(native);
      local_50[0].twine = (Twine *)local_40;
      lVar6 = *(long *)((long)pbVar2 + lVar8 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,lVar6,
                 *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar8) + lVar6);
      std::__cxx11::string::append(&local_50[0].character);
      lVar6 = std::__cxx11::string::_M_append
                        (&local_50[0].character,(ulong)(local_58->_M_dataplus)._M_p);
      AVar1.buffer = (char  [8])(lVar6 + 0x10);
      if ((char  [8])*(AlignedCharArray<8UL,_8UL> *)lVar6 == AVar1.buffer) {
        local_98 = *(char **)AVar1.buffer;
        uStack_90 = *(undefined8 *)(lVar6 + 0x18);
        local_a8.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
             (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
              )&local_98;
      }
      else {
        local_98 = *(char **)AVar1.buffer;
        local_a8.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
             (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
              )(char  [8])*(AlignedCharArray<8UL,_8UL> *)lVar6;
      }
      local_a8._8_8_ = *(undefined8 *)(lVar6 + 8);
      *(char (*) [8])lVar6 = AVar1.buffer;
      *(undefined8 *)(lVar6 + 8) = 0;
      *(undefined1 *)(lVar6 + 0x10) = 0;
      std::__cxx11::string::operator=((string *)IncludedFile,(string *)&local_a8.TStorage);
      if (local_a8.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
          (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
           )&local_98) {
        operator_delete((void *)local_a8.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer,
                        (ulong)(local_98 + 1));
      }
      if (&(local_50[0].twine)->LHS != local_40) {
        operator_delete(local_50[0].twine,(ulong)((long)&(local_40[0].twine)->LHS + 1));
      }
      Twine::Twine((Twine *)local_50,IncludedFile);
      MemoryBuffer::getFile
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                  *)&local_a8.TStorage,(Twine *)local_50,-1,true,false);
      ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
      moveAssign<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  *)&local_80.TStorage,
                 (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                  *)&local_a8.TStorage);
      if (((ulong)local_98 & 1) == 0) {
        if ((AlignedCharArray<8UL,_8UL>)local_a8.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
            (AlignedCharArray<8UL,_8UL>)0x0) {
          (**(code **)(*(char **)local_a8.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
        }
        local_a8.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
             (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
              )(AlignedCharArray<8UL,_8UL>)0x0;
      }
    } while ((uVar5 != 0) && (lVar8 = lVar8 + 0x20, (local_70 & 1) != 0));
  }
  pSVar4 = local_68;
  uVar3 = local_80.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
  uVar7 = 0;
  if ((local_70 & 1) == 0) {
    local_80.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )(AlignedCharArray<8UL,_8UL>)0x0;
    local_a8._8_8_ = 0;
    local_a8.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )(AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
            )uVar3;
    local_98 = local_60;
    std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::
    emplace_back<llvm::SourceMgr::SrcBuffer>(&local_68->Buffers,(SrcBuffer *)&local_a8.TStorage);
    uVar7 = (int)((ulong)((long)(pSVar4->Buffers).
                                super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pSVar4->Buffers).
                               super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    SrcBuffer::~SrcBuffer((SrcBuffer *)&local_a8.TStorage);
  }
  if (((local_70 & 1) == 0) &&
     ((AlignedCharArray<8UL,_8UL>)local_80.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
      (AlignedCharArray<8UL,_8UL>)0x0)) {
    (**(code **)(*(char **)local_80.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
  }
  return uVar7;
}

Assistant:

unsigned SourceMgr::AddIncludeFile(const std::string &Filename,
                                   SMLoc IncludeLoc,
                                   std::string &IncludedFile) {
  IncludedFile = Filename;
  ErrorOr<std::unique_ptr<MemoryBuffer>> NewBufOrErr =
    MemoryBuffer::getFile(IncludedFile);

  // If the file didn't exist directly, see if it's in an include path.
  for (unsigned i = 0, e = IncludeDirectories.size(); i != e && !NewBufOrErr;
       ++i) {
    IncludedFile =
        IncludeDirectories[i] + sys::path::get_separator().data() + Filename;
    NewBufOrErr = MemoryBuffer::getFile(IncludedFile);
  }

  if (!NewBufOrErr)
    return 0;

  return AddNewSourceBuffer(std::move(*NewBufOrErr), IncludeLoc);
}